

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  float *pfVar1;
  bool bVar2;
  int iVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  ImGuiWindow *window_1;
  int i_1;
  float memory_compact_start_time;
  ImGuiWindow *window;
  int i;
  ImGuiViewportP *viewport;
  int n_1;
  int n;
  ImRect virtual_space;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_000003b4;
  bool *in_stack_000003b8;
  char *in_stack_000003c0;
  int in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float fVar7;
  ImVec2 in_stack_ffffffffffffff88;
  ImGuiContext *in_stack_ffffffffffffff90;
  int local_68;
  float fVar8;
  undefined1 restore_focus_to_window_under_popup;
  ImGuiWindow *in_stack_ffffffffffffffa0;
  ImVec2 local_54;
  int local_4c;
  ImGuiViewportP *local_48;
  int local_40;
  ImVec4 local_3c;
  ImRect local_2c;
  int local_1c;
  ImRect local_18;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  GImGui->ConfigFlagsLastFrame = GImGui->ConfigFlagsCurrFrame;
  NewFrameSanityChecks();
  local_8->ConfigFlagsCurrFrame = (local_8->IO).ConfigFlags;
  if ((local_8->SettingsLoaded & 1U) == 0) {
    if ((local_8->IO).IniFilename != (char *)0x0) {
      LoadIniSettingsFromDisk((char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70))
      ;
    }
    local_8->SettingsLoaded = true;
  }
  if ((0.0 < local_8->SettingsDirtyTimer) &&
     (local_8->SettingsDirtyTimer = local_8->SettingsDirtyTimer - (local_8->IO).DeltaTime,
     local_8->SettingsDirtyTimer <= 0.0)) {
    if ((local_8->IO).IniFilename == (char *)0x0) {
      (local_8->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk((char *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    }
    local_8->SettingsDirtyTimer = 0.0;
  }
  local_8->Time = (double)(local_8->IO).DeltaTime + local_8->Time;
  local_8->WithinFrameScope = true;
  local_8->FrameCount = local_8->FrameCount + 1;
  local_8->TooltipOverrideCount = 0;
  local_8->WindowsActiveCount = 0;
  UpdateViewportsNewFrame();
  ((local_8->IO).Fonts)->Locked = true;
  GetDefaultFont();
  SetCurrentFont((ImFont *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 in_stack_ffffffffffffff70);
  for (local_1c = 0; local_1c < (local_8->Viewports).Size; local_1c = local_1c + 1) {
    ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_1c);
    local_2c = ImGuiViewportP::GetRect((ImGuiViewportP *)0x1aa935);
    ImRect::Add(&local_18,&local_2c);
  }
  ImVec4::ImVec4(&local_3c,local_18.Min.x,local_18.Min.y,local_18.Max.x,local_18.Max.y);
  (local_8->DrawListSharedData).ClipRectFullscreen.x = local_3c.x;
  (local_8->DrawListSharedData).ClipRectFullscreen.y = local_3c.y;
  (local_8->DrawListSharedData).ClipRectFullscreen.z = local_3c.z;
  (local_8->DrawListSharedData).ClipRectFullscreen.w = local_3c.w;
  (local_8->DrawListSharedData).CurveTessellationTol = (local_8->Style).CurveTessellationTol;
  (local_8->DrawListSharedData).InitialFlags = 0;
  if (((local_8->Style).AntiAliasedLines & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 1;
  }
  if (((local_8->Style).AntiAliasedFill & 1U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 2;
  }
  if (((local_8->IO).BackendFlags & 8U) != 0) {
    (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 4;
  }
  for (local_40 = 0; local_40 < (local_8->Viewports).Size; local_40 = local_40 + 1) {
    ppIVar4 = ImVector<ImGuiViewportP_*>::operator[](&local_8->Viewports,local_40);
    local_48 = *ppIVar4;
    (local_48->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    ImDrawData::Clear((ImDrawData *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  }
  if (((local_8->DragDropActive & 1U) != 0) &&
     ((local_8->DragDropPayload).SourceId == local_8->ActiveId)) {
    KeepAliveID((local_8->DragDropPayload).SourceId);
  }
  if (local_8->HoveredIdPreviousFrame == 0) {
    local_8->HoveredIdTimer = 0.0;
  }
  if ((local_8->HoveredIdPreviousFrame == 0) ||
     ((local_8->HoveredId != 0 && (local_8->ActiveId == local_8->HoveredId)))) {
    local_8->HoveredIdNotActiveTimer = 0.0;
  }
  if (local_8->HoveredId != 0) {
    local_8->HoveredIdTimer = (local_8->IO).DeltaTime + local_8->HoveredIdTimer;
  }
  if ((local_8->HoveredId != 0) && (local_8->ActiveId != local_8->HoveredId)) {
    local_8->HoveredIdNotActiveTimer = (local_8->IO).DeltaTime + local_8->HoveredIdNotActiveTimer;
  }
  local_8->HoveredIdPreviousFrame = local_8->HoveredId;
  local_8->HoveredId = 0;
  local_8->HoveredIdAllowOverlap = false;
  if (((local_8->ActiveIdIsAlive != local_8->ActiveId) &&
      (local_8->ActiveIdPreviousFrame == local_8->ActiveId)) && (local_8->ActiveId != 0)) {
    ClearActiveID();
  }
  if (local_8->ActiveId != 0) {
    local_8->ActiveIdTimer = (local_8->IO).DeltaTime + local_8->ActiveIdTimer;
  }
  local_8->LastActiveIdTimer = (local_8->IO).DeltaTime + local_8->LastActiveIdTimer;
  local_8->ActiveIdPreviousFrame = local_8->ActiveId;
  local_8->ActiveIdPreviousFrameWindow = local_8->ActiveIdWindow;
  local_8->ActiveIdPreviousFrameHasBeenEditedBefore =
       (bool)(local_8->ActiveIdHasBeenEditedBefore & 1);
  local_8->ActiveIdIsAlive = 0;
  local_8->ActiveIdHasBeenEditedThisFrame = false;
  local_8->ActiveIdPreviousFrameIsAlive = false;
  local_8->ActiveIdIsJustActivated = false;
  if ((local_8->TempInputTextId != 0) && (local_8->ActiveId != local_8->TempInputTextId)) {
    local_8->TempInputTextId = 0;
  }
  if (local_8->ActiveId == 0) {
    local_8->ActiveIdUsingNavInputMask = 0;
    local_8->ActiveIdUsingNavDirMask = 0;
    local_8->ActiveIdUsingKeyInputMask = 0;
  }
  local_8->DragDropAcceptIdPrev = local_8->DragDropAcceptIdCurr;
  local_8->DragDropAcceptIdCurr = 0;
  local_8->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  local_8->DragDropWithinSourceOrTarget = false;
  memcpy((local_8->IO).KeysDownDurationPrev,(local_8->IO).KeysDownDuration,0x800);
  for (local_4c = 0; local_4c < 0x200; local_4c = local_4c + 1) {
    if (((local_8->IO).KeysDown[local_4c] & 1U) == 0) {
      fVar7 = -1.0;
    }
    else {
      pfVar1 = (local_8->IO).KeysDownDuration + local_4c;
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        fVar7 = (local_8->IO).KeysDownDuration[local_4c] + (local_8->IO).DeltaTime;
      }
      else {
        fVar7 = 0.0;
      }
    }
    (local_8->IO).KeysDownDuration[local_4c] = fVar7;
  }
  NavUpdate();
  UpdateMouseInputs();
  local_8->FramerateSecPerFrameAccum =
       ((local_8->IO).DeltaTime - local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx]) +
       local_8->FramerateSecPerFrameAccum;
  local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx] = (local_8->IO).DeltaTime;
  local_8->FramerateSecPerFrameIdx = (local_8->FramerateSecPerFrameIdx + 1) % 0x78;
  if (local_8->FramerateSecPerFrameAccum <= 0.0) {
    fVar7 = 3.4028235e+38;
  }
  else {
    fVar7 = 1.0 / (local_8->FramerateSecPerFrameAccum / 120.0);
  }
  (local_8->IO).Framerate = fVar7;
  DockContextUpdateUndocking(in_stack_ffffffffffffff90);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar5 = GetTopMostPopupModal();
  if ((pIVar5 != (ImGuiWindow *)0x0) ||
     ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < local_8->NavWindowingHighlightAlpha)))) {
    fVar7 = ImMin<float>((local_8->IO).DeltaTime * 6.0 + local_8->DimBgRatio,1.0);
    local_8->DimBgRatio = fVar7;
  }
  else {
    fVar7 = ImMax<float>(-(local_8->IO).DeltaTime * 10.0 + local_8->DimBgRatio,0.0);
    local_8->DimBgRatio = fVar7;
  }
  local_8->MouseCursor = 0;
  local_8->WantTextInputNextFrame = -1;
  local_8->WantCaptureKeyboardNextFrame = -1;
  local_8->WantCaptureMouseNextFrame = -1;
  ImVec2::ImVec2(&local_54,1.0,1.0);
  local_8->PlatformImePos = local_54;
  local_8->PlatformImePosViewport = (ImGuiViewportP *)0x0;
  UpdateMouseWheel();
  bVar2 = false;
  if ((((local_8->NavWindow != (ImGuiWindow *)0x0) &&
       (bVar2 = false, (local_8->NavWindow->Active & 1U) != 0)) &&
      (bVar2 = false, (local_8->NavWindow->Flags & 0x40000U) == 0)) &&
     (bVar2 = false, ((local_8->IO).KeyCtrl & 1U) == 0)) {
    bVar2 = IsKeyPressedMap((ImGuiKey)in_stack_ffffffffffffff74,
                            SUB41((uint)in_stack_ffffffffffffff70 >> 0x18,0));
  }
  local_8->FocusTabPressed = bVar2;
  if ((local_8->ActiveId == 0) && ((local_8->FocusTabPressed & 1U) != 0)) {
    local_8->FocusRequestNextWindow = local_8->NavWindow;
    local_8->FocusRequestNextCounterAll = 0x7fffffff;
    if ((local_8->NavId == 0) || (local_8->NavIdTabCounter == 0x7fffffff)) {
      iVar3 = 0;
      if (((local_8->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      local_8->FocusRequestNextCounterTab = iVar3;
    }
    else {
      iVar3 = 1;
      if (((local_8->IO).KeyShift & 1U) != 0) {
        iVar3 = -1;
      }
      local_8->FocusRequestNextCounterTab = local_8->NavIdTabCounter + 1 + iVar3;
    }
  }
  local_8->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  local_8->FocusRequestCurrCounterTab = 0x7fffffff;
  local_8->FocusRequestCurrCounterAll = 0x7fffffff;
  if (local_8->FocusRequestNextWindow != (ImGuiWindow *)0x0) {
    in_stack_ffffffffffffffa0 = local_8->FocusRequestNextWindow;
    local_8->FocusRequestCurrWindow = in_stack_ffffffffffffffa0;
    if ((local_8->FocusRequestNextCounterAll != 0x7fffffff) &&
       ((in_stack_ffffffffffffffa0->DC).FocusCounterAll != -1)) {
      iVar3 = ImModPositive(local_8->FocusRequestNextCounterAll,
                            (in_stack_ffffffffffffffa0->DC).FocusCounterAll + 1);
      local_8->FocusRequestCurrCounterAll = iVar3;
    }
    if ((local_8->FocusRequestNextCounterTab != 0x7fffffff) &&
       ((in_stack_ffffffffffffffa0->DC).FocusCounterTab != -1)) {
      iVar3 = ImModPositive(local_8->FocusRequestNextCounterTab,
                            (in_stack_ffffffffffffffa0->DC).FocusCounterTab + 1);
      local_8->FocusRequestCurrCounterTab = iVar3;
    }
    local_8->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    local_8->FocusRequestNextCounterTab = 0x7fffffff;
    local_8->FocusRequestNextCounterAll = 0x7fffffff;
  }
  local_8->NavIdTabCounter = 0x7fffffff;
  if ((local_8->IO).ConfigWindowsMemoryCompactTimer < 0.0) {
    fVar7 = 3.4028235e+38;
  }
  else {
    fVar7 = (float)local_8->Time - (local_8->IO).ConfigWindowsMemoryCompactTimer;
  }
  fVar8 = fVar7;
  for (local_68 = 0; local_68 != (local_8->Windows).Size; local_68 = local_68 + 1) {
    ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_68);
    in_stack_ffffffffffffff90 = (ImGuiContext *)*ppIVar6;
    *(byte *)&(in_stack_ffffffffffffff90->IO).FontGlobalScale =
         *(byte *)((long)&(in_stack_ffffffffffffff90->IO).Fonts + 7) & 1;
    *(short *)((long)&(in_stack_ffffffffffffff90->IO).FontDefault + 2) = 0;
    *(undefined1 *)((long)&(in_stack_ffffffffffffff90->IO).Fonts + 7) = 0;
    *(bool *)((long)&(in_stack_ffffffffffffff90->IO).FontGlobalScale + 1) = false;
    if (((((uint)(in_stack_ffffffffffffff90->IO).FontGlobalScale & 1) == 0) &&
        (((ulong)(in_stack_ffffffffffffff90->IO).MouseClickedTime[1] & 1) == 0)) &&
       (*(float *)((in_stack_ffffffffffffff90->IO).KeysDown + 0x150) < fVar8)) {
      GcCompactTransientWindowBuffers((ImGuiWindow *)0x1ab5e0);
    }
  }
  if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->WasActive & 1U) == 0)) {
    FocusTopMostWindowUnderOne
              ((ImGuiWindow *)in_stack_ffffffffffffff90,(ImGuiWindow *)in_stack_ffffffffffffff88);
  }
  restore_focus_to_window_under_popup = (undefined1)((uint)fVar8 >> 0x18);
  ImVector<ImGuiWindow_*>::resize
            ((ImVector<ImGuiWindow_*> *)CONCAT44(fVar7,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  ImVector<ImGuiPopupData>::resize
            ((ImVector<ImGuiPopupData> *)CONCAT44(fVar7,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff6c);
  ClosePopupsOverWindow(in_stack_ffffffffffffffa0,(bool)restore_focus_to_window_under_popup);
  DockContextUpdateDocking(in_stack_ffffffffffffff90);
  UpdateDebugToolItemPicker();
  local_8->WithinFrameScopeWithImplicitWindow = true;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,400.0,400.0);
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffff88,4);
  Begin(in_stack_000003c0,in_stack_000003b8,in_stack_000003b4);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    NewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = g.ActiveIdUsingNavInputMask = 0;
        g.ActiveIdUsingKeyInputMask = 0;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect (this is totally functional but we may need decide if the side-effects are desirable)
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}